

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  int iVar1;
  char *__assertion;
  TValue v;
  Value local_18;
  ushort local_10;
  
  if (obj->tt_ == 0x13) {
    local_18.n = (lua_Number)(obj->value_).i;
  }
  else {
    iVar1 = l_strton(obj,(TValue *)&local_18);
    if (iVar1 == 0) {
      return 0;
    }
    if ((local_10 & 0xf) != 3) {
      __assertion = "(((((((&v))->tt_)) & 0x0F)) == (3))";
LAB_00124a20:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x6e,"int luaV_tonumber_(const TValue *, lua_Number *)");
    }
    if (local_10 != 3) {
      if (local_10 != 0x13) {
        __assertion = "((((&v))->tt_) == (((3) | ((0) << 4))))";
        goto LAB_00124a20;
      }
      local_18.n = (lua_Number)local_18.i;
    }
  }
  *n = (lua_Number)local_18;
  return 1;
}

Assistant:

int luaV_tonumber_ (const TValue *obj, lua_Number *n) {
  TValue v;
  if (ttisinteger(obj)) {
    *n = cast_num(ivalue(obj));
    return 1;
  }
  else if (l_strton(obj, &v)) {  /* string coercible to number? */
    *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
    return 1;
  }
  else
    return 0;  /* conversion failed */
}